

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

int __thiscall
FIX::Session::verify
          (Session *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  FieldMap *this_00;
  IntTConvertor<unsigned_long> *this_01;
  IntTConvertor<unsigned_long> *this_02;
  bool bVar1;
  FieldBase *msgType;
  FieldBase *senderCompID;
  FieldBase *targetCompID;
  FieldBase *sendingTime;
  IntTConvertor<unsigned_long> *pIVar2;
  undefined8 extraout_RAX;
  logic_error *this_03;
  SessionID *sessionID;
  unsigned_long value;
  unsigned_long value_00;
  byte bVar3;
  byte local_144;
  FieldBase *local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [88];
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = (FieldMap *)(ctx + 0x70);
  sessionID = (SessionID *)siglen;
  msgType = FieldMap::getFieldRef(this_00,0x23);
  senderCompID = FieldMap::getFieldRef(this_00,0x31);
  targetCompID = FieldMap::getFieldRef(this_00,0x38);
  sendingTime = FieldMap::getFieldRef(this_00,0x34);
  local_144 = (byte)siglen;
  bVar3 = (byte)sig | local_144;
  if (bVar3 == 1) {
    local_138 = FieldMap::getFieldRef(this_00,0x22);
  }
  else {
    local_138 = (FieldBase *)0x0;
  }
  bVar1 = validLogonState(this,(MsgType *)msgType);
  if (!bVar1) {
    this_03 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_03,"Logon state is not valid for message");
    __cxa_throw(this_03,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  bVar1 = isGoodTime(this,(SendingTime *)sendingTime);
  if (!bVar1) {
    doBadTime(this,(Message *)ctx);
    return 0;
  }
  bVar1 = isCorrectCompID(this,(SenderCompID *)senderCompID,(TargetCompID *)targetCompID);
  if (!bVar1) {
    doBadCompID(this,(Message *)ctx);
    return 0;
  }
  if ((byte)sig == 0) {
    if (local_144 != 0) goto LAB_001ae515;
    if (bVar3 == 0) goto LAB_001ae655;
  }
  else {
    bVar1 = isTargetTooHigh(this,(MsgSeqNum *)local_138);
    if (bVar1) {
      doTargetTooHigh(this,(Message *)ctx);
      return 0;
    }
    if (local_144 != 0) {
LAB_001ae515:
      bVar1 = isTargetTooLow(this,(MsgSeqNum *)local_138);
      if (bVar1) {
        doTargetTooLow(this,(Message *)ctx);
        return 0;
      }
    }
  }
  this_01 = (IntTConvertor<unsigned_long> *)(this->m_state).m_resendRange.first;
  this_02 = (IntTConvertor<unsigned_long> *)(this->m_state).m_resendRange.second;
  if ((this_01 != (IntTConvertor<unsigned_long> *)0x0 ||
       this_02 != (IntTConvertor<unsigned_long> *)0x0) &&
     (pIVar2 = (IntTConvertor<unsigned_long> *)UInt64Field::getValue((UInt64Field *)local_138),
     this_02 <= pIVar2)) {
    IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_90,this_01,value);
    std::operator+(&local_70,"ResendRequest for messages FROM: ",&local_90);
    std::operator+(&local_50,&local_70," TO: ");
    IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_b0,this_02,value_00);
    std::operator+(&local_128,&local_50,&local_b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   &local_128," has been satisfied.");
    SessionState::onEvent(&this->m_state,(string *)local_108);
    std::__cxx11::string::~string((string *)local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    (this->m_state).m_resendRange.first = 0;
    (this->m_state).m_resendRange.second = 0;
  }
LAB_001ae655:
  std::function<FIX::UtcTimeStamp_()>::operator()((UtcTimeStamp *)local_108,&this->m_timestamper);
  *(undefined8 *)&(this->m_state).m_lastReceivedTime.super_DateTime.m_date = local_108._8_8_;
  (this->m_state).m_lastReceivedTime.super_DateTime.m_time = local_108._16_8_;
  (this->m_state).m_testRequest = 0;
  MsgType::MsgType((MsgType *)local_108,(MsgType *)msgType);
  fromCallback(this,(MsgType *)local_108,(Message *)ctx,sessionID);
  FieldBase::~FieldBase((FieldBase *)local_108);
  return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
}

Assistant:

bool Session::verify(const Message &msg, bool checkTooHigh, bool checkTooLow) {
  const MsgType *pMsgType = 0;
  const MsgSeqNum *pMsgSeqNum = 0;

  try {
    const Header &header = msg.getHeader();

    pMsgType = FIELD_GET_PTR(header, MsgType);
    const SenderCompID &senderCompID = FIELD_GET_REF(header, SenderCompID);
    const TargetCompID &targetCompID = FIELD_GET_REF(header, TargetCompID);
    const SendingTime &sendingTime = FIELD_GET_REF(header, SendingTime);

    if (checkTooHigh || checkTooLow) {
      pMsgSeqNum = FIELD_GET_PTR(header, MsgSeqNum);
    }

    if (!validLogonState(*pMsgType)) {
      throw std::logic_error("Logon state is not valid for message");
    }

    if (!isGoodTime(sendingTime)) {
      doBadTime(msg);
      return false;
    }
    if (!isCorrectCompID(senderCompID, targetCompID)) {
      doBadCompID(msg);
      return false;
    }

    if (checkTooHigh && isTargetTooHigh(*pMsgSeqNum)) {
      doTargetTooHigh(msg);
      return false;
    } else if (checkTooLow && isTargetTooLow(*pMsgSeqNum)) {
      doTargetTooLow(msg);
      return false;
    }

    if ((checkTooHigh || checkTooLow) && m_state.resendRequested()) {
      SessionState::ResendRange range = m_state.resendRange();

      if (*pMsgSeqNum >= range.second) {
        m_state.onEvent(
            "ResendRequest for messages FROM: " + SEQNUM_CONVERTOR::convert(range.first)
            + " TO: " + SEQNUM_CONVERTOR::convert(range.second) + " has been satisfied.");
        m_state.resendRange(0, 0);
      }
    }
  } catch (std::exception &e) {
    m_state.onEvent(e.what());
    disconnect();
    return false;
  }

  m_state.lastReceivedTime(m_timestamper());
  m_state.testRequest(0);

  fromCallback(pMsgType ? *pMsgType : MsgType(), msg, m_sessionID);
  return true;
}